

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O2

void am_generic_renew_copied_comp(Am_Object *object)

{
  Am_Object *__s;
  bool bVar1;
  unsigned_short uVar2;
  Am_Slot_Key AVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  ulong *puVar6;
  int value;
  long lVar7;
  Am_Object *pAVar8;
  Am_Object current_component;
  Am_Object part;
  Am_Object local_78;
  Am_Value_List components;
  Am_Part_Iterator parts;
  Am_Value_List new_components;
  
  Am_Value_List::Am_Value_List(&components);
  pAVar4 = Am_Object::Get(object,0x82,0);
  Am_Value_List::operator=(&components,pAVar4);
  Am_Value_List::Am_Value_List(&new_components);
  Am_Object::Am_Object(&local_78,object);
  Am_Part_Iterator::Am_Part_Iterator(&parts,&local_78);
  Am_Object::~Am_Object(&local_78);
  uVar2 = Am_Part_Iterator::Length(&parts);
  bVar1 = Am_Value_List::Empty(&components);
  if (uVar2 == 0 || bVar1) {
    Am_Value_List::Am_Value_List((Am_Value_List *)&part);
    pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&part);
    Am_Object::Set(object,0x82,pAVar5,0);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&part);
  }
  else {
    puVar6 = (ulong *)operator_new__((ulong)uVar2 * 0x10 + 8);
    *puVar6 = (ulong)((uint)uVar2 + (uint)uVar2);
    __s = (Am_Object *)(puVar6 + 1);
    memset(__s,0,(ulong)uVar2 * 0x10);
    part.data = (Am_Object_Data *)0x0;
    Am_Part_Iterator::Start(&parts);
    pAVar8 = __s;
    while( true ) {
      bVar1 = Am_Part_Iterator::Last(&parts);
      if (bVar1) break;
      Am_Part_Iterator::Get((Am_Part_Iterator *)&current_component);
      Am_Object::operator=(&part,&current_component);
      Am_Object::~Am_Object(&current_component);
      Am_Object::operator=(pAVar8 + uVar2,&part);
      pAVar4 = Am_Object::Get(&part,0xc,0);
      Am_Object::operator=(pAVar8,pAVar4);
      pAVar8 = pAVar8 + 1;
      Am_Part_Iterator::Next(&parts);
    }
    current_component.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&components);
    value = 0;
    while( true ) {
      bVar1 = Am_Value_List::Last(&components);
      if (bVar1) break;
      pAVar4 = Am_Value_List::Get(&components);
      Am_Object::operator=(&current_component,pAVar4);
      AVar3 = Am_Object::Get_Key(&current_component);
      if (AVar3 != 2) {
        pAVar8 = __s;
        for (lVar7 = -8; (ulong)((uint)uVar2 * 8) + 8 + lVar7 != 0; lVar7 = lVar7 + -8) {
          bVar1 = Am_Object::operator==(&current_component,pAVar8);
          if (bVar1) {
            pAVar8 = (Am_Object *)((long)puVar6 + ((ulong)((uint)uVar2 * 8) - lVar7));
            Am_Object::Set(pAVar8,0x85,value,0);
            pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
            Am_Value_List::Add(&new_components,pAVar5,Am_TAIL,true);
            value = value + 1;
            break;
          }
          pAVar8 = pAVar8 + 1;
        }
      }
      Am_Value_List::Next(&components);
    }
    if (*puVar6 != 0) {
      lVar7 = *puVar6 << 3;
      do {
        Am_Object::~Am_Object((Am_Object *)((long)puVar6 + lVar7));
        lVar7 = lVar7 + -8;
      } while (lVar7 != 0);
    }
    operator_delete__(puVar6);
    pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_components);
    Am_Object::Set(object,0x82,pAVar5,0);
    Am_Object::~Am_Object(&current_component);
    Am_Object::~Am_Object(&part);
  }
  Am_Part_Iterator::~Am_Part_Iterator(&parts);
  Am_Value_List::~Am_Value_List(&new_components);
  Am_Value_List::~Am_Value_List(&components);
  return;
}

Assistant:

void
am_generic_renew_copied_comp(Am_Object object)
{
  Am_Value_List components;
  components = object.Get(Am_GRAPHICAL_PARTS);
  Am_Value_List new_components;
  Am_Part_Iterator parts = object;
  int parts_length = parts.Length();
  if (components.Empty() || (parts_length == 0)) {
    object.Set(Am_GRAPHICAL_PARTS, Am_Value_List());
    return;
  }
  Am_Object *part_map = new Am_Object[parts_length * 2];
  Am_Object part;
  int i;
  for (i = 0, parts.Start(); !parts.Last(); ++i, parts.Next()) {
    part = parts.Get();
    part_map[i + parts_length] = part;
    part_map[i] = part.Get(Am_SOURCE_OF_COPY);
  }
  Am_Object current_component;
  int current_rank = 0;
  for (components.Start(); !components.Last(); components.Next()) {
    current_component = components.Get();
    if (current_component.Get_Key() == Am_NO_INHERIT)
      continue;
    for (i = 0; i < parts_length; ++i)
      if (current_component == part_map[i]) {
        part_map[i + parts_length].Set(Am_RANK, current_rank);
        new_components.Add(part_map[i + parts_length]);
        ++current_rank;
        break;
      }
  }
  delete[] part_map;
  object.Set(Am_GRAPHICAL_PARTS, new_components);
}